

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::SetPropertyDefault(cmTarget *this,string *property,char *default_value)

{
  char *value_00;
  char *value;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string var;
  char *default_value_local;
  string *property_local;
  cmTarget *this_local;
  
  var.field_2._8_8_ = default_value;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"CMAKE_",&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::__cxx11::string::operator+=((string *)local_40,(string *)property);
  value_00 = cmMakefile::GetDefinition(this->Makefile,(string *)local_40);
  if (value_00 == (char *)0x0) {
    if (var.field_2._8_8_ != 0) {
      SetProperty(this,property,(char *)var.field_2._8_8_);
    }
  }
  else {
    SetProperty(this,property,value_00);
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmTarget::SetPropertyDefault(const std::string& property,
                                  const char* default_value)
{
  // Compute the name of the variable holding the default value.
  std::string var = "CMAKE_";
  var += property;

  if (const char* value = this->Makefile->GetDefinition(var)) {
    this->SetProperty(property, value);
  } else if (default_value) {
    this->SetProperty(property, default_value);
  }
}